

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O3

Matrix33d * gmath::inv(Matrix33d *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Matrix33d *ret;
  Matrix33d *in_RDI;
  double dVar10;
  double dVar11;
  
  dVar1 = a->v[1][1];
  dVar2 = a->v[0][0];
  dVar3 = a->v[0][1];
  dVar4 = a->v[2][1];
  dVar5 = a->v[2][2];
  dVar6 = a->v[0][2];
  dVar7 = a->v[1][0];
  dVar8 = a->v[1][2];
  dVar9 = a->v[2][0];
  dVar10 = dVar1 * -dVar6;
  dVar11 = 1.0 / ((dVar4 * -dVar8 * dVar2 +
                  dVar9 * dVar10 +
                  dVar9 * dVar3 * dVar8 + dVar5 * dVar2 * dVar1 + dVar7 * dVar4 * dVar6) -
                 dVar7 * dVar3 * dVar5);
  in_RDI->v[0][0] = (dVar1 * dVar5 + dVar4 * -dVar8) * dVar11;
  in_RDI->v[0][1] = (dVar6 * dVar4 + dVar5 * -dVar3) * dVar11;
  in_RDI->v[0][2] = (dVar3 * dVar8 + dVar10) * dVar11;
  in_RDI->v[1][0] = (dVar8 * dVar9 + dVar5 * -dVar7) * dVar11;
  in_RDI->v[1][1] = (-dVar6 * dVar9 + dVar5 * dVar2) * dVar11;
  in_RDI->v[1][2] = (-dVar2 * dVar8 + dVar7 * dVar6) * dVar11;
  in_RDI->v[2][0] = (dVar4 * dVar7 - dVar9 * dVar1) * dVar11;
  in_RDI->v[2][1] = (dVar9 * dVar3 - dVar4 * dVar2) * dVar11;
  in_RDI->v[2][2] = (-dVar3 * dVar7 + dVar2 * dVar1) * dVar11;
  return in_RDI;
}

Assistant:

Matrix33d inv(const Matrix33d &a)
{
  double d=det(a);

  assert(d != 0);

  d=1.0/d;

  Matrix33d ret;

  ret(0, 0)=d*(a(1, 1)*a(2, 2)-a(1, 2)*a(2, 1));
  ret(0, 1)=d*(a(0, 2)*a(2, 1)-a(0, 1)*a(2, 2));
  ret(0, 2)=d*(a(0, 1)*a(1, 2)-a(0, 2)*a(1, 1));

  ret(1, 0)=d*(a(1, 2)*a(2, 0)-a(1, 0)*a(2, 2));
  ret(1, 1)=d*(a(0, 0)*a(2, 2)-a(0, 2)*a(2, 0));
  ret(1, 2)=d*(a(0, 2)*a(1, 0)-a(0, 0)*a(1, 2));

  ret(2, 0)=d*(a(1, 0)*a(2, 1)-a(1, 1)*a(2, 0));
  ret(2, 1)=d*(a(0, 1)*a(2, 0)-a(0, 0)*a(2, 1));
  ret(2, 2)=d*(a(0, 0)*a(1, 1)-a(0, 1)*a(1, 0));

  return ret;
}